

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCuts.c
# Opt level: O0

int Aig_ManCutCount(Aig_ManCut_t *p,int *pnCutsK)

{
  int iVar1;
  Aig_Obj_t *pObj_00;
  int local_38;
  int local_34;
  int nCutsK;
  int nCuts;
  int k;
  int i;
  Aig_Obj_t *pObj;
  Aig_Cut_t *pCut;
  int *pnCutsK_local;
  Aig_ManCut_t *p_local;
  
  local_34 = 0;
  local_38 = 0;
  for (nCuts = 0; iVar1 = Vec_PtrSize(p->pAig->vObjs), nCuts < iVar1; nCuts = nCuts + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,nCuts);
    if ((pObj_00 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pObj_00), iVar1 != 0)) {
      nCutsK = 0;
      pObj = (Aig_Obj_t *)Aig_ObjCuts(p,pObj_00);
      while (nCutsK < p->nCutsMax) {
        if ((*(char *)((long)&pObj->pFanin1 + 7) != '\0') &&
           (local_34 = local_34 + 1, (int)*(char *)((long)&pObj->pFanin1 + 7) == p->nLeafMax)) {
          local_38 = local_38 + 1;
        }
        nCutsK = nCutsK + 1;
        pObj = (Aig_Obj_t *)Aig_CutNext((Aig_Cut_t *)pObj);
      }
    }
  }
  if (pnCutsK != (int *)0x0) {
    *pnCutsK = local_38;
  }
  return local_34;
}

Assistant:

int Aig_ManCutCount( Aig_ManCut_t * p, int * pnCutsK )
{
    Aig_Cut_t * pCut;
    Aig_Obj_t * pObj;
    int i, k, nCuts = 0, nCutsK = 0;
    Aig_ManForEachNode( p->pAig, pObj, i )
        Aig_ObjForEachCut( p, pObj, pCut, k )
        {
            if ( pCut->nFanins == 0 )
                continue;
            nCuts++;
            if ( pCut->nFanins == p->nLeafMax )
                nCutsK++;
        }
    if ( pnCutsK )
        *pnCutsK = nCutsK;
    return nCuts;
}